

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O1

Vector3f __thiscall pbrt::OctahedralVector::operator_cast_to_Vector3(OctahedralVector *this)

{
  bool bVar1;
  undefined1 auVar2 [16];
  float fVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  Vector3f VVar14;
  
  auVar2 = vpmovzxwd_avx(ZEXT416((uint)*this));
  auVar2 = vcvtdq2ps_avx(auVar2);
  auVar13._8_4_ = 0x40000000;
  auVar13._0_8_ = 0x4000000040000000;
  auVar13._12_4_ = 0x40000000;
  auVar7._8_4_ = 0x477fff00;
  auVar7._0_8_ = 0x477fff00477fff00;
  auVar7._12_4_ = 0x477fff00;
  auVar7 = vdivps_avx512vl(auVar2,auVar7);
  auVar2._8_4_ = 0xbf800000;
  auVar2._0_8_ = 0xbf800000bf800000;
  auVar2._12_4_ = 0xbf800000;
  auVar8 = vfmadd213ps_avx512vl(auVar13,auVar7,auVar2);
  auVar5._8_4_ = 0x7fffffff;
  auVar5._0_8_ = 0x7fffffff7fffffff;
  auVar5._12_4_ = 0x7fffffff;
  auVar7 = vandps_avx512vl(auVar8,auVar5);
  auVar2 = vhaddps_avx(auVar7,auVar7);
  fVar3 = 1.0 - auVar2._0_4_;
  if (fVar3 < 0.0) {
    auVar12._8_4_ = 0x3f800000;
    auVar12._0_8_ = 0x3f8000003f800000;
    auVar12._12_4_ = 0x3f800000;
    auVar2 = vshufps_avx(auVar7,auVar7,0xe1);
    uVar4 = vcmpps_avx512vl(auVar8,ZEXT816(0) << 0x40,1);
    auVar2 = vsubps_avx(auVar12,auVar2);
    auVar6._8_4_ = 0x80000000;
    auVar6._0_8_ = 0x8000000080000000;
    auVar6._12_4_ = 0x80000000;
    auVar7 = vxorps_avx512vl(auVar2,auVar6);
    bVar1 = (bool)((byte)uVar4 & 1);
    auVar8._0_4_ = (uint)bVar1 * auVar7._0_4_ | (uint)!bVar1 * auVar2._0_4_;
    bVar1 = (bool)((byte)(uVar4 >> 1) & 1);
    auVar8._4_4_ = (uint)bVar1 * auVar7._4_4_ | (uint)!bVar1 * auVar2._4_4_;
    bVar1 = (bool)((byte)(uVar4 >> 2) & 1);
    auVar8._8_4_ = (uint)bVar1 * auVar7._8_4_ | (uint)!bVar1 * auVar2._8_4_;
    bVar1 = (bool)((byte)(uVar4 >> 3) & 1);
    auVar8._12_4_ = (uint)bVar1 * auVar7._12_4_ | (uint)!bVar1 * auVar2._12_4_;
  }
  auVar10._0_4_ = auVar8._0_4_ * auVar8._0_4_;
  auVar10._4_4_ = auVar8._4_4_ * auVar8._4_4_;
  auVar10._8_4_ = auVar8._8_4_ * auVar8._8_4_;
  auVar10._12_4_ = auVar8._12_4_ * auVar8._12_4_;
  auVar2 = vhaddps_avx(auVar10,auVar10);
  fVar9 = fVar3 * fVar3 + auVar2._0_4_;
  if (fVar9 < 0.0) {
    fVar9 = sqrtf(fVar9);
  }
  else {
    auVar2 = vsqrtss_avx(ZEXT416((uint)fVar9),ZEXT416((uint)fVar9));
    fVar9 = auVar2._0_4_;
  }
  auVar11._4_4_ = fVar9;
  auVar11._0_4_ = fVar9;
  auVar11._8_4_ = fVar9;
  auVar11._12_4_ = fVar9;
  auVar2 = vdivps_avx(auVar8,auVar11);
  VVar14.super_Tuple3<pbrt::Vector3,_float>.z = fVar3 / fVar9;
  VVar14.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar2._0_8_;
  return (Vector3f)VVar14.super_Tuple3<pbrt::Vector3,_float>;
}

Assistant:

operator Vector3f() const {
        Vector3f v;
        v.x = -1 + 2 * (x / 65535.f);
        v.y = -1 + 2 * (y / 65535.f);
        v.z = 1 - (std::abs(v.x) + std::abs(v.y));
        // Reparameterize directions in the $z<0$ portion of the octahedron
        if (v.z < 0) {
            Float xo = v.x;
            v.x = (1 - std::abs(v.y)) * SignNotZero(xo);
            v.y = (1 - std::abs(xo)) * SignNotZero(v.y);
        }

        return Normalize(v);
    }